

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O2

int dotakeoff(obj *otmp)

{
  char cVar1;
  boolean bVar2;
  int iVar3;
  char *pcVar4;
  
  if (otmp == (obj *)0x0) {
    otmp = getobj("\x03\x04\x05\x06\a","take off",(obj **)0x0);
    if (otmp == (obj *)0x0) {
      return 0;
    }
  }
  else {
    bVar2 = validate_object(otmp,"\x03","take off");
    if (bVar2 == '\0') {
      return 0;
    }
  }
  if (otmp->oclass != '\x03') {
    iVar3 = doremring(otmp);
    return iVar3;
  }
  if ((otmp->owornmask & 0x7f) == 0) {
    pcVar4 = "You are not wearing that.";
  }
  else {
    if (otmp == uskin) {
      pcVar4 = "dragon scale mail is";
      if ((ushort)(uskin->otyp - 0x5fU) < 0xb) {
        pcVar4 = "dragon scales are";
      }
      pline("The %s merged with your skin!",pcVar4);
      return 0;
    }
    if (otmp != uarm || uarmc == (obj *)0x0) {
      if ((otmp != uarmu) || (uarm == (obj *)0x0 && uarmc == (obj *)0x0)) {
        takeoff_mask = 0;
        taking_off = 0;
        disrobing = (char *)0x0;
        select_off(otmp);
        if (takeoff_mask == 0) {
          return 0;
        }
        takeoff_mask = 0;
        taking_off = 0;
        disrobing = (char *)0x0;
        cVar1 = objects[otmp->otyp].oc_delay;
        iVar3 = cursed(otmp);
        if (iVar3 != 0) {
          return 1;
        }
        if (cVar1 != '\0') {
          nomul(-(int)cVar1,"disrobing");
          off_msg_str(otmp,'\x01' < cVar1,'\x01');
          nomovemsg = off_msg_str::buf;
          if (otmp->oclass == '\x03') {
            cVar1 = objects[otmp->otyp].oc_subtyp;
            if (cVar1 == '\x04') {
              afternmv = Boots_off;
              takeoff_mask = 0;
              taking_off = 0;
              return 1;
            }
            if (cVar1 == '\x03') {
              afternmv = Gloves_off;
              takeoff_mask = 0;
              taking_off = 0;
              return 1;
            }
            if (cVar1 == '\x02') {
              afternmv = Helmet_off;
              takeoff_mask = 0;
              taking_off = 0;
              return 1;
            }
          }
          afternmv = Armor_off;
          takeoff_mask = 0;
          taking_off = 0;
          return 1;
        }
        if (otmp->oclass == '\x03') {
          cVar1 = objects[otmp->otyp].oc_subtyp;
          if (cVar1 == '\x01') {
            Shield_off();
            goto LAB_00182e2b;
          }
          if (cVar1 == '\x06') {
            Shirt_off();
            goto LAB_00182e2b;
          }
          if (cVar1 == '\x05') {
            Cloak_off();
            goto LAB_00182e2b;
          }
        }
        setworn((obj *)0x0,(ulong)(otmp->owornmask & 0x7f));
LAB_00182e2b:
        off_msg(otmp,'\x01');
        takeoff_mask = 0;
        taking_off = 0;
        return 1;
      }
    }
    pcVar4 = "The rest of your armor is in the way.";
  }
  pline(pcVar4);
  return 0;
}

Assistant:

int dotakeoff(struct obj *otmp)
{
	if (otmp && !validate_object(otmp, clothes, "take off"))
		return 0;
	else if (!otmp)
		otmp = getobj(clothes_and_accessories, "take off", NULL);
	if (!otmp) return 0;
        if (otmp->oclass != ARMOR_CLASS) return doremring(otmp);
	if (!(otmp->owornmask & W_ARMOR)) {
		pline("You are not wearing that.");
		return 0;
	}
	if (otmp == uskin) {
	        pline("The %s merged with your skin!",
		      Is_dragon_scales(uskin->otyp) ?
		      "dragon scales are" : "dragon scale mail is");
		return 0;
	}
	if (((otmp == uarm) && uarmc) ||
            ((otmp == uarmu) && (uarmc || uarm))) {
            /* TODO: replace this with a multistep remove */
	    pline("The rest of your armor is in the way.");
	    return 0;
	}

	reset_remarm();		/* clear takeoff_mask and taking_off */
	select_off(otmp);
	if (!takeoff_mask) return 0;
	reset_remarm();		/* armoroff() doesn't use takeoff_mask */

	armoroff(otmp);
	return 1;
}